

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

void prvTidystrrep(tmbstr buffer,ctmbstr str,ctmbstr rep)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  char local_428 [8];
  char buf [1024];
  char *p;
  ctmbstr rep_local;
  ctmbstr str_local;
  tmbstr buffer_local;
  
  buf._1016_8_ = strstr(buffer,str);
  do {
    if (buf._1016_8_ != 0) {
      sVar2 = strlen(local_428);
      memset(local_428,0,sVar2);
      if (buffer == (tmbstr)buf._1016_8_) {
        strcpy(local_428,rep);
        uVar1 = buf._1016_8_;
        sVar2 = strlen(str);
        strcat(local_428,(char *)(uVar1 + sVar2));
      }
      else {
        sVar2 = strlen(buffer);
        sVar3 = strlen((char *)buf._1016_8_);
        strncpy(local_428,buffer,sVar2 - sVar3);
        strcat(local_428,rep);
        uVar1 = buf._1016_8_;
        sVar2 = strlen(str);
        strcat(local_428,(char *)(uVar1 + sVar2));
      }
      sVar2 = strlen(buffer);
      memset(buffer,0,sVar2);
      strcpy(buffer,local_428);
    }
    bVar4 = false;
    if (buf._1016_8_ != 0) {
      buf._1016_8_ = strstr(buffer,str);
      bVar4 = (char *)buf._1016_8_ != (char *)0x0;
    }
  } while (bVar4);
  return;
}

Assistant:

void TY_(strrep)(tmbstr buffer, ctmbstr str, ctmbstr rep)
{
    char *p = strstr(buffer, str);
    do
    {
        if(p)
        {
            char buf[1024];
            memset(buf,'\0',strlen(buf));

            if(buffer == p)
            {
                strcpy(buf,rep);
                strcat(buf,p+strlen(str));
            }
            else
            {
                strncpy(buf,buffer,strlen(buffer) - strlen(p));
                strcat(buf,rep);
                strcat(buf,p+strlen(str));
            }

            memset(buffer,'\0',strlen(buffer));
            strcpy(buffer,buf);
        }

    } while(p && (p = strstr(buffer, str)));
}